

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ncons.cc
# Opt level: O0

int print_nc_ipadd(BIO *bp,ASN1_OCTET_STRING *ip)

{
  int iVar1;
  byte *pbStack_30;
  uint16_t v;
  uchar *p;
  int len;
  int i;
  ASN1_OCTET_STRING *ip_local;
  BIO *bp_local;
  
  pbStack_30 = ip->data;
  iVar1 = ip->length;
  BIO_puts((BIO *)bp,"IP:");
  if (iVar1 == 8) {
    BIO_printf((BIO *)bp,"%d.%d.%d.%d/%d.%d.%d.%d",(ulong)*pbStack_30,(ulong)pbStack_30[1],
               (ulong)pbStack_30[2],(ulong)pbStack_30[3],(uint)pbStack_30[4],(uint)pbStack_30[5],
               (uint)pbStack_30[6],(uint)pbStack_30[7]);
  }
  else if (iVar1 == 0x20) {
    for (p._4_4_ = 0; p._4_4_ < 0x10; p._4_4_ = p._4_4_ + 1) {
      BIO_printf((BIO *)bp,"%X",(ulong)CONCAT11(*pbStack_30,pbStack_30[1]));
      pbStack_30 = pbStack_30 + 2;
      if (p._4_4_ == 7) {
        BIO_puts((BIO *)bp,"/");
      }
      else if (p._4_4_ != 0xf) {
        BIO_puts((BIO *)bp,":");
      }
    }
  }
  else {
    BIO_printf((BIO *)bp,"IP Address:<invalid>");
  }
  return 1;
}

Assistant:

static int print_nc_ipadd(BIO *bp, const ASN1_OCTET_STRING *ip) {
  int i, len;
  unsigned char *p;
  p = ip->data;
  len = ip->length;
  BIO_puts(bp, "IP:");
  if (len == 8) {
    BIO_printf(bp, "%d.%d.%d.%d/%d.%d.%d.%d", p[0], p[1], p[2], p[3], p[4],
               p[5], p[6], p[7]);
  } else if (len == 32) {
    for (i = 0; i < 16; i++) {
      uint16_t v = ((uint16_t)p[0] << 8) | p[1];
      BIO_printf(bp, "%X", v);
      p += 2;
      if (i == 7) {
        BIO_puts(bp, "/");
      } else if (i != 15) {
        BIO_puts(bp, ":");
      }
    }
  } else {
    BIO_printf(bp, "IP Address:<invalid>");
  }
  return 1;
}